

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

PNode * heap_pop(VecPNode *a)

{
  uint uVar1;
  uint uVar2;
  PNode **ppPVar3;
  PNode *pPVar4;
  int iVar5;
  
  uVar2 = a->n;
  if (uVar2 == 0) {
    pPVar4 = (PNode *)0x0;
  }
  else {
    ppPVar3 = a->v;
    pPVar4 = *ppPVar3;
    uVar1 = uVar2 - 1;
    *ppPVar3 = ppPVar3[uVar1];
    a->n = uVar1;
    if (2 < uVar2) {
      iVar5 = (uVar1 >> 1) + 1;
      do {
        heapify(a,iVar5 - 2);
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
  }
  return pPVar4;
}

Assistant:

PNode *heap_pop(VecPNode *a) {
  if (a->n == 0) return NULL;
  PNode *pn = a->v[0];
  a->v[0] = a->v[a->n -1];
  a->n--;
  for (int i = a->n / 2 - 1; i >= 0; i--)
    heapify(a, i);
  return pn;
}